

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O1

Curl_addrinfo * Curl_he2ai(hostent *he,int port)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  Curl_addrinfo *pCVar4;
  char *pcVar5;
  sockaddr *psVar6;
  Curl_addrinfo *pCVar7;
  char *pcVar8;
  curl_socklen_t cVar9;
  long lVar10;
  bool bVar11;
  Curl_addrinfo *local_40;
  
  if (he != (hostent *)0x0) {
    pcVar8 = *he->h_addr_list;
    if (pcVar8 == (char *)0x0) {
      bVar11 = true;
      pCVar7 = (Curl_addrinfo *)0x0;
    }
    else {
      iVar3 = 0;
      lVar10 = 8;
      local_40 = (Curl_addrinfo *)0x0;
      pCVar7 = (Curl_addrinfo *)0x0;
      do {
        cVar9 = 0x10;
        if (he->h_addrtype == 10) {
          cVar9 = 0x1c;
        }
        pCVar4 = (Curl_addrinfo *)(*Curl_ccalloc)(1,0x30);
        if (pCVar4 == (Curl_addrinfo *)0x0) {
LAB_0013bcdd:
          bVar11 = false;
          iVar3 = 0x1b;
        }
        else {
          pcVar5 = (*Curl_cstrdup)(he->h_name);
          pCVar4->ai_canonname = pcVar5;
          if (pcVar5 == (char *)0x0) {
            (*Curl_cfree)(pCVar4);
            goto LAB_0013bcdd;
          }
          psVar6 = (sockaddr *)(*Curl_ccalloc)(1,(size_t)cVar9);
          pCVar4->ai_addr = psVar6;
          if (psVar6 == (sockaddr *)0x0) {
            (*Curl_cfree)(pCVar4->ai_canonname);
            (*Curl_cfree)(pCVar4);
            goto LAB_0013bcdd;
          }
          if (pCVar7 == (Curl_addrinfo *)0x0) {
            pCVar7 = pCVar4;
          }
          if (local_40 != (Curl_addrinfo *)0x0) {
            local_40->ai_next = pCVar4;
          }
          iVar1 = he->h_addrtype;
          pCVar4->ai_family = iVar1;
          pCVar4->ai_socktype = 1;
          pCVar4->ai_addrlen = cVar9;
          bVar11 = true;
          local_40 = pCVar4;
          if (iVar1 == 10) {
            uVar2 = *(undefined8 *)(pcVar8 + 8);
            *(undefined8 *)(psVar6->sa_data + 6) = *(undefined8 *)pcVar8;
            psVar6[1].sa_family = (short)uVar2;
            psVar6[1].sa_data[0] = (char)((ulong)uVar2 >> 0x10);
            psVar6[1].sa_data[1] = (char)((ulong)uVar2 >> 0x18);
            psVar6[1].sa_data[2] = (char)((ulong)uVar2 >> 0x20);
            psVar6[1].sa_data[3] = (char)((ulong)uVar2 >> 0x28);
            psVar6[1].sa_data[4] = (char)((ulong)uVar2 >> 0x30);
            psVar6[1].sa_data[5] = (char)((ulong)uVar2 >> 0x38);
LAB_0013bcf3:
            psVar6->sa_family = (sa_family_t)he->h_addrtype;
            *(ushort *)psVar6->sa_data = (ushort)port << 8 | (ushort)port >> 8;
          }
          else if (iVar1 == 2) {
            *(undefined4 *)(psVar6->sa_data + 2) = *(undefined4 *)pcVar8;
            goto LAB_0013bcf3;
          }
        }
        if (!bVar11) break;
        pcVar8 = *(char **)((long)he->h_addr_list + lVar10);
        lVar10 = lVar10 + 8;
      } while (pcVar8 != (char *)0x0);
      bVar11 = iVar3 == 0;
    }
    if (bVar11) {
      return pCVar7;
    }
    while (pCVar7 != (Curl_addrinfo *)0x0) {
      (*Curl_cfree)(pCVar7->ai_addr);
      (*Curl_cfree)(pCVar7->ai_canonname);
      pCVar4 = pCVar7->ai_next;
      (*Curl_cfree)(pCVar7);
      pCVar7 = pCVar4;
    }
  }
  return (Curl_addrinfo *)0x0;
}

Assistant:

Curl_addrinfo *
Curl_he2ai(const struct hostent *he, int port)
{
  Curl_addrinfo *ai;
  Curl_addrinfo *prevai = NULL;
  Curl_addrinfo *firstai = NULL;
  struct sockaddr_in *addr;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 *addr6;
#endif
  CURLcode result = CURLE_OK;
  int i;
  char *curr;

  if(!he)
    /* no input == no output! */
    return NULL;

  DEBUGASSERT((he->h_name != NULL) && (he->h_addr_list != NULL));

  for(i=0; (curr = he->h_addr_list[i]) != NULL; i++) {

    size_t ss_size;
#ifdef ENABLE_IPV6
    if(he->h_addrtype == AF_INET6)
      ss_size = sizeof (struct sockaddr_in6);
    else
#endif
      ss_size = sizeof (struct sockaddr_in);

    if((ai = calloc(1, sizeof(Curl_addrinfo))) == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      break;
    }
    if((ai->ai_canonname = strdup(he->h_name)) == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      free(ai);
      break;
    }
    if((ai->ai_addr = calloc(1, ss_size)) == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      free(ai->ai_canonname);
      free(ai);
      break;
    }

    if(!firstai)
      /* store the pointer we want to return from this function */
      firstai = ai;

    if(prevai)
      /* make the previous entry point to this */
      prevai->ai_next = ai;

    ai->ai_family = he->h_addrtype;

    /* we return all names as STREAM, so when using this address for TFTP
       the type must be ignored and conn->socktype be used instead! */
    ai->ai_socktype = SOCK_STREAM;

    ai->ai_addrlen = (curl_socklen_t)ss_size;

    /* leave the rest of the struct filled with zero */

    switch (ai->ai_family) {
    case AF_INET:
      addr = (void *)ai->ai_addr; /* storage area for this info */

      memcpy(&addr->sin_addr, curr, sizeof(struct in_addr));
      addr->sin_family = (unsigned short)(he->h_addrtype);
      addr->sin_port = htons((unsigned short)port);
      break;

#ifdef ENABLE_IPV6
    case AF_INET6:
      addr6 = (void *)ai->ai_addr; /* storage area for this info */

      memcpy(&addr6->sin6_addr, curr, sizeof(struct in6_addr));
      addr6->sin6_family = (unsigned short)(he->h_addrtype);
      addr6->sin6_port = htons((unsigned short)port);
      break;
#endif
    }

    prevai = ai;
  }

  if(result) {
    Curl_freeaddrinfo(firstai);
    firstai = NULL;
  }

  return firstai;
}